

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxPropertyName.cpp
# Opt level: O3

void __thiscall Jinx::Impl::PropertyName::Read(PropertyName *this,BinaryReader *reader)

{
  size_t *pos;
  undefined8 in_RAX;
  uint8_t b;
  uchar v;
  unsigned_short v_1;
  undefined8 uStack_28;
  
  pos = &reader->m_pos;
  uStack_28 = in_RAX;
  Buffer::Read<unsigned_long*>
            ((reader->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pos,&this->m_id);
  uStack_28._0_5_ = (uint5)(uint)uStack_28;
  Buffer::Read<unsigned_char*>
            ((reader->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pos,(uchar *)((long)&uStack_28 + 4));
  this->m_readOnly = uStack_28._4_1_ != '\0';
  BinaryReader::Read(reader,&this->m_name);
  Buffer::Read<unsigned_char*>
            ((reader->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pos,(uchar *)((long)&uStack_28 + 5));
  this->m_visibility = (uint)uStack_28._5_1_;
  Buffer::Read<unsigned_short*>
            ((reader->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pos,(unsigned_short *)((long)&uStack_28 + 6));
  this->m_partCount = uStack_28 >> 0x30;
  Variant::Read(&this->m_defaultValue,reader);
  return;
}

Assistant:

inline_t void PropertyName::Read(BinaryReader & reader)
	{
		reader.Read(&m_id);
		reader.Read(&m_readOnly);
		reader.Read(&m_name);
		reader.Read<VisibilityType, uint8_t>(&m_visibility);
		reader.Read<size_t, uint16_t>(&m_partCount);
		m_defaultValue.Read(reader);
	}